

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type __thiscall
FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>
::fastAccessDx(FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>
               *this,int i)

{
  value_type vVar1;
  value_type vVar2;
  
  vVar1 = FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>
          ::fastAccessDx(&this->left_->fadexpr_,i);
  vVar2 = FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>::
          fastAccessDx(&this->right_->fadexpr_,i);
  return vVar2 + vVar1;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i)+right_.fastAccessDx(i);}